

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateAndCleanMathCiCnNodes
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component,NameList *variableNames)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<libcellml::XmlNode> local_58 [2];
  undefined1 local_38 [8];
  XmlNodePtr childNode;
  NameList *variableNames_local;
  ComponentPtr *component_local;
  XmlNodePtr *node_local;
  ValidatorImpl *this_local;
  
  childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)variableNames;
  peVar2 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar1 = XmlNode::isMathmlElement(peVar2,"cn");
  if (bVar1) {
    validateAndCleanCnNode(this,node,component);
  }
  else {
    peVar2 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    bVar1 = XmlNode::isMathmlElement(peVar2,"ci");
    if (bVar1) {
      validateAndCleanCiNode
                (this,node,component,
                 (NameList *)
                 childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)local_38);
  bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    validateAndCleanMathCiCnNodes
              (this,(XmlNodePtr *)local_38,component,
               (NameList *)
               childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::next((XmlNode *)local_58);
  std::shared_ptr<libcellml::XmlNode>::operator=(node,local_58);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr(local_58);
  bVar1 = std::operator!=(node,(nullptr_t)0x0);
  if (bVar1) {
    validateAndCleanMathCiCnNodes
              (this,node,component,
               (NameList *)
               childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_38);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateAndCleanMathCiCnNodes(XmlNodePtr &node, const ComponentPtr &component, const NameList &variableNames)
{
    if (node->isMathmlElement("cn")) {
        validateAndCleanCnNode(node, component);
    } else if (node->isMathmlElement("ci")) {
        validateAndCleanCiNode(node, component, variableNames);
    }
    // Check children for ci/cn.
    XmlNodePtr childNode = node->firstChild();
    if (childNode != nullptr) {
        validateAndCleanMathCiCnNodes(childNode, component, variableNames);
    }
    // Check siblings for ci/cn.
    node = node->next();
    if (node != nullptr) {
        validateAndCleanMathCiCnNodes(node, component, variableNames);
    }
}